

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineCtorsPass.cpp
# Opt level: O0

PreservedAnalyses * __thiscall
InlineCtorsPass::run
          (PreservedAnalyses *__return_storage_ptr__,InlineCtorsPass *this,Function *F,
          FunctionAnalysisManager *FM)

{
  ArrayRef<llvm::Value_*> Args;
  ArrayRef<llvm::Value_*> Args_00;
  bool bVar1;
  ulong uVar2;
  Module *pMVar3;
  GlobalVariable *Tors;
  iterator ppVar4;
  iterator ppVar5;
  reference InsertBefore;
  reference pIVar6;
  StringRef SVar7;
  Twine local_240;
  ArrayRef<llvm::Value_*> local_218;
  FunctionCallee local_200;
  iterator local_1f0;
  pair<llvm::Function_*,_unsigned_long> *KV_1;
  iterator __end2;
  iterator __begin2;
  SmallVector<std::pair<llvm::Function_*,_unsigned_long>,_4U> *__range2;
  inst_iterator E;
  inst_iterator I_1;
  ArrayRef<llvm::Value_*> local_178;
  FunctionCallee local_160;
  iterator local_150;
  pair<llvm::Function_*,_unsigned_long> *KV;
  iterator __end1;
  iterator __begin1;
  SmallVector<std::pair<llvm::Function_*,_unsigned_long>,_4U> *__range1;
  iterator I;
  BasicBlock *BBEntry;
  undefined1 local_118 [8];
  SmallVector<std::pair<llvm::Function_*,_unsigned_long>,_4U> Dtors;
  undefined1 local_b8 [8];
  SmallVector<std::pair<llvm::Function_*,_unsigned_long>,_4U> Ctors;
  GlobalVariable *GlobalDtors;
  GlobalVariable *local_40;
  GlobalVariable *GlobalCtors;
  FunctionAnalysisManager *local_28;
  FunctionAnalysisManager *FM_local;
  Function *F_local;
  InlineCtorsPass *this_local;
  
  local_28 = FM;
  FM_local = (FunctionAnalysisManager *)F;
  F_local = (Function *)this;
  this_local = (InlineCtorsPass *)__return_storage_ptr__;
  llvm::StringRef::StringRef((StringRef *)&GlobalCtors,"shellvm-main");
  SVar7.Length = (size_t)GlobalCtors;
  SVar7.Data = (char *)F;
  uVar2 = llvm::Function::hasFnAttribute(SVar7);
  if ((uVar2 & 1) == 0) {
    llvm::PreservedAnalyses::all();
  }
  else {
    pMVar3 = llvm::GlobalValue::getParent((GlobalValue *)FM_local);
    llvm::StringRef::StringRef((StringRef *)&GlobalDtors,"llvm.global_ctors");
    local_40 = llvm::Module::getNamedGlobal(pMVar3,_GlobalDtors);
    pMVar3 = llvm::GlobalValue::getParent((GlobalValue *)FM_local);
    llvm::StringRef::StringRef
              ((StringRef *)
               (Ctors.super_SmallVectorStorage<std::pair<llvm::Function_*,_unsigned_long>,_4U>.
                InlineElts + 0x38),"llvm.global_dtors");
    Tors = llvm::Module::getNamedGlobal(pMVar3,stack0xffffffffffffff98);
    if ((local_40 == (GlobalVariable *)0x0) && (Tors == (GlobalVariable *)0x0)) {
      llvm::PreservedAnalyses::all();
    }
    else {
      llvm::SmallVector<std::pair<llvm::Function_*,_unsigned_long>,_4U>::SmallVector
                ((SmallVector<std::pair<llvm::Function_*,_unsigned_long>,_4U> *)local_b8);
      getFunctions(this,local_40,
                   (SmallVectorImpl<std::pair<llvm::Function_*,_unsigned_long>_> *)local_b8);
      llvm::SmallVector<std::pair<llvm::Function_*,_unsigned_long>,_4U>::SmallVector
                ((SmallVector<std::pair<llvm::Function_*,_unsigned_long>,_4U> *)local_118);
      getFunctions(this,Tors,
                   (SmallVectorImpl<std::pair<llvm::Function_*,_unsigned_long>_> *)local_118);
      ppVar4 = llvm::SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>::
               begin((SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void> *)
                     local_b8);
      ppVar5 = llvm::SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>::
               end((SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void> *)
                   local_b8);
      std::
      sort<std::pair<llvm::Function*,unsigned_long>*,InlineCtorsPass::run(llvm::Function&,llvm::AnalysisManager<llvm::Function>&)::__0>
                (ppVar4,ppVar5);
      ppVar4 = llvm::SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>::
               begin((SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void> *)
                     local_b8);
      ppVar5 = llvm::SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>::
               end((SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void> *)
                   local_b8);
      std::
      sort<std::pair<llvm::Function*,unsigned_long>*,InlineCtorsPass::run(llvm::Function&,llvm::AnalysisManager<llvm::Function>&)::__1>
                (ppVar4,ppVar5);
      I.NodePtr = (node_pointer)llvm::Function::getEntryBlock((Function *)FM_local);
      __range1 = (SmallVector<std::pair<llvm::Function_*,_unsigned_long>,_4U> *)
                 llvm::BasicBlock::begin((BasicBlock *)I.NodePtr);
      while (bVar1 = llvm::
                     isa<llvm::AllocaInst,llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,false,false,void>,false,false>>
                               ((ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
                                 *)&__range1), bVar1) {
        llvm::
        ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
        ::operator++((ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
                      *)&__range1);
      }
      __begin1 = (iterator)local_b8;
      __end1 = llvm::SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>::
               begin((SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void> *)
                     __begin1);
      KV = llvm::SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>::end
                     ((SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void> *
                      )__begin1);
      for (; __end1 != KV; __end1 = __end1 + 1) {
        local_150 = __end1;
        llvm::FunctionCallee::
        FunctionCallee<llvm::Function,llvm::FunctionType*(llvm::Function::*)()const>
                  (&local_160,__end1->first);
        local_178.Data = (Value **)0x0;
        local_178.Length = 0;
        llvm::ArrayRef<llvm::Value_*>::ArrayRef(&local_178);
        llvm::Twine::Twine((Twine *)&I_1.BI,"");
        InsertBefore = llvm::
                       ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
                       ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
                                    *)&__range1);
        Args_00.Length = local_178.Length;
        Args_00.Data = local_178.Data;
        llvm::CallInst::Create(local_160,Args_00,(Twine *)&I_1.BI,InsertBefore);
      }
      llvm::inst_begin((inst_iterator *)&E.BI,(Function *)FM_local);
      llvm::inst_end((inst_iterator *)&__range2,(Function *)FM_local);
      while (bVar1 = llvm::
                     InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>
                     ::operator!=((InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>
                                   *)&E.BI,(InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>
                                            *)&__range2), bVar1) {
        pIVar6 = llvm::
                 InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>
                 ::operator*((InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>
                              *)&E.BI);
        bVar1 = llvm::isa<llvm::ReturnInst,llvm::Instruction>(pIVar6);
        if (bVar1) {
          __begin2 = (iterator)local_118;
          __end2 = llvm::SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>
                   ::begin((SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>
                            *)__begin2);
          KV_1 = llvm::SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void>::
                 end((SmallVectorTemplateCommon<std::pair<llvm::Function_*,_unsigned_long>,_void> *)
                     __begin2);
          for (; __end2 != KV_1; __end2 = __end2 + 1) {
            local_1f0 = __end2;
            llvm::FunctionCallee::
            FunctionCallee<llvm::Function,llvm::FunctionType*(llvm::Function::*)()const>
                      (&local_200,__end2->first);
            local_218.Data = (Value **)0x0;
            local_218.Length = 0;
            llvm::ArrayRef<llvm::Value_*>::ArrayRef(&local_218);
            llvm::Twine::Twine(&local_240,"");
            pIVar6 = llvm::
                     InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>
                     ::operator*((InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>
                                  *)&E.BI);
            Args.Length = local_218.Length;
            Args.Data = local_218.Data;
            llvm::CallInst::Create(local_200,Args,&local_240,pIVar6);
          }
        }
        llvm::
        InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>
        ::operator++((InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>
                      *)&E.BI);
      }
      if (local_40 != (GlobalVariable *)0x0) {
        llvm::GlobalVariable::removeFromParent();
      }
      if (Tors != (GlobalVariable *)0x0) {
        llvm::GlobalVariable::removeFromParent();
      }
      llvm::PreservedAnalyses::none();
      llvm::SmallVector<std::pair<llvm::Function_*,_unsigned_long>,_4U>::~SmallVector
                ((SmallVector<std::pair<llvm::Function_*,_unsigned_long>,_4U> *)local_118);
      llvm::SmallVector<std::pair<llvm::Function_*,_unsigned_long>,_4U>::~SmallVector
                ((SmallVector<std::pair<llvm::Function_*,_unsigned_long>,_4U> *)local_b8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

llvm::PreservedAnalyses InlineCtorsPass::run(Function &F,
                                             FunctionAnalysisManager &FM) {
  if (!F.hasFnAttribute("shellvm-main")) {

    return llvm::PreservedAnalyses::all();
  }

  GlobalVariable *GlobalCtors =
      F.getParent()->getNamedGlobal("llvm.global_ctors");
  GlobalVariable *GlobalDtors =
      F.getParent()->getNamedGlobal("llvm.global_dtors");
  if (!GlobalCtors && !GlobalDtors) {
    return llvm::PreservedAnalyses::all();
  }

  SmallVector<FunctionPair, 4> Ctors;
  getFunctions(GlobalCtors, Ctors);
  SmallVector<FunctionPair, 4> Dtors;
  getFunctions(GlobalDtors, Dtors);

  // Sort constructors in ascending order of priority
  std::sort(Ctors.begin(), Ctors.end(),
            [](const FunctionPair &A, const FunctionPair &B) -> bool {
              return A.second > B.second;
            });

  // Sort destructors in descending order of priority
  std::sort(Ctors.begin(), Ctors.end(),
            [](const FunctionPair &A, const FunctionPair &B) -> bool {
              return A.second < B.second;
            });

  {
    BasicBlock *BBEntry = &F.getEntryBlock();
    BasicBlock::iterator I = BBEntry->begin();
    // Place calls to constructors after alloca
    while (isa<AllocaInst>(I))
      ++I;

    for (auto &KV : Ctors) {
      CallInst::Create(KV.first, ArrayRef<Value *>(), "", &*I);
    }
  }

  // Search for ret instructions
  for (inst_iterator I = inst_begin(F), E = inst_end(F); I != E; ++I) {
    if (!isa<ReturnInst>(*I)) {
      continue;
    }

    for (auto &KV : Dtors) {
      CallInst::Create(KV.first, ArrayRef<Value *>(), "", &*I);
    }
  }

  // Delete llvm.global_ctors and llvm.global_dtors to prevent duplicate calls
  if (GlobalCtors)
    GlobalCtors->removeFromParent();
  if (GlobalDtors)
    GlobalDtors->removeFromParent();

  return llvm::PreservedAnalyses::none();
}